

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O3

void __thiscall
streams_tests::streams_serializedata_xor::test_method(streams_serializedata_xor *this)

{
  pointer pbVar1;
  int iVar2;
  size_type sVar3;
  pointer puVar4;
  undefined8 in_R9;
  iterator pvVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  initializer_list<unsigned_char> __l;
  const_string file;
  Span<const_std::byte> sp;
  initializer_list<unsigned_char> __l_00;
  const_string file_00;
  Span<const_std::byte> sp_00;
  initializer_list<unsigned_char> __l_01;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  lazy_ostream local_168;
  undefined1 *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  DataStream ds;
  vector<std::byte,_std::allocator<std::byte>_> in;
  string *local_f0;
  undefined1 **local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  undefined1 ***local_c8;
  char *local_c0;
  char *local_b8;
  assertion_result local_b0;
  undefined **local_98;
  undefined1 local_90;
  undefined1 *local_88;
  string **local_80;
  long *local_78;
  size_t local_70;
  long local_68 [2];
  undefined1 *local_58;
  size_t local_50;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined5 uStack_45;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  DataStream::DataStream(&ds,(Span<const_std::byte>)ZEXT816(0));
  local_98 = (undefined **)((ulong)local_98 & 0xffffffffffff0000);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_98;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_e0,__l,(allocator_type *)&local_168);
  pbVar1 = ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start + ds.m_read_pos;
  bVar7 = (pointer)CONCAT71(local_e0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish._1_7_,
                            local_e0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish._0_1_) ==
          local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  pvVar5 = (iterator)CONCAT71((int7)((ulong)in_R9 >> 8),bVar7);
  puVar4 = (pointer)CONCAT71((int7)((ulong)pbVar1 >> 8),
                             pbVar1 == ds.vch.
                                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                       ._M_impl.super__Vector_impl_data._M_finish || bVar7);
  if (pbVar1 != ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish && !bVar7) {
    puVar4 = (pointer)0x0;
    sVar3 = ds.m_read_pos;
    do {
      ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start[sVar3] =
           ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start[sVar3] ^
           local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[(long)puVar4];
      puVar4 = puVar4 + 1;
      pvVar5 = (iterator)0x0;
      if (puVar4 == (pointer)CONCAT71(local_e0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                      local_e0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._0_1_) +
                    -(long)local_e0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start) {
        puVar4 = (pointer)0x0;
      }
      sVar3 = sVar3 + 1;
    } while ((long)ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                   _M_impl.super__Vector_impl_data._M_start != sVar3);
  }
  if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xe5;
  file.m_begin = (iterator)&local_138;
  msg.m_end = pvVar5;
  msg.m_begin = (iterator)puVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_58 = &local_48;
  local_50 = 0;
  local_48 = 0;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)&local_78,
             ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start + ds.m_read_pos,
             ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if (local_50 == local_70) {
    if (local_50 == 0) {
      local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar2 = bcmp(local_58,local_78,local_50);
      local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == 0);
    }
  }
  else {
    local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_b8 = "";
  local_e8 = &local_58;
  local_c8 = &local_e8;
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae148;
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_f0;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013ae148;
  local_88 = boost::unit_test::lazy_ostream::inst;
  uVar6 = 0;
  local_f0 = (string *)&local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_168,1,2,REQUIRE,0xf465ed,(size_t)&local_c0,0xe5,&local_e0,"ds.str()",
             &local_98);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT53(uStack_45,CONCAT12(uStack_46,CONCAT11(uStack_47,local_48))) +
                             1);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ds);
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0xf;
  std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>(&in,(byte *)&local_e0)
  ;
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,0xf0);
  std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>(&in,(byte *)&local_e0)
  ;
  sp.m_size = (long)in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
  sp.m_data = in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start;
  DataStream::DataStream(&ds,sp);
  local_98 = (undefined **)CONCAT71(local_98._1_7_,0xff);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_98;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_e0,__l_00,(allocator_type *)&local_168);
  pbVar1 = ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start + ds.m_read_pos;
  bVar7 = (pointer)CONCAT71(local_e0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish._1_7_,
                            local_e0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish._0_1_) ==
          local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  pvVar5 = (iterator)CONCAT71((int7)((ulong)uVar6 >> 8),bVar7);
  puVar4 = (pointer)CONCAT71((int7)((ulong)pbVar1 >> 8),
                             pbVar1 == ds.vch.
                                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                       ._M_impl.super__Vector_impl_data._M_finish || bVar7);
  if (pbVar1 != ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish && !bVar7) {
    puVar4 = (pointer)0x0;
    sVar3 = ds.m_read_pos;
    do {
      ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start[sVar3] =
           ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start[sVar3] ^
           local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[(long)puVar4];
      puVar4 = puVar4 + 1;
      pvVar5 = (iterator)0x0;
      if (puVar4 == (pointer)CONCAT71(local_e0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                      local_e0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._0_1_) +
                    -(long)local_e0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start) {
        puVar4 = (pointer)0x0;
      }
      sVar3 = sVar3 + 1;
    } while ((long)ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                   _M_impl.super__Vector_impl_data._M_start != sVar3);
  }
  if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xef;
  file_00.m_begin = (iterator)&local_178;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = (iterator)puVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_188,
             msg_00);
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_58 = &local_48;
  local_48 = 0xf0;
  uStack_47 = 0xf;
  local_50 = 2;
  uStack_46 = 0;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)&local_78,
             ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start + ds.m_read_pos,
             ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if (local_50 == local_70) {
    if (local_50 == 0) {
      local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar2 = bcmp(local_58,local_78,local_50);
      local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == 0);
    }
  }
  else {
    local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_b8 = "";
  local_e8 = &local_58;
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae148;
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_e8;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013ae148;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_f0;
  uVar6 = 0;
  local_f0 = (string *)&local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_168,1,2,REQUIRE,0xf465fa,(size_t)&local_c0,0xef,&local_e0,"ds.str()",
             &local_98);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT53(uStack_45,CONCAT12(uStack_46,CONCAT11(uStack_47,local_48))) +
                             1);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ds);
  if (in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
    _M_finish = in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0xf0;
  std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>(&in,(byte *)&local_e0)
  ;
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,0xf);
  std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>(&in,(byte *)&local_e0)
  ;
  sp_00.m_size = (long)in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start;
  sp_00.m_data = in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
  DataStream::DataStream(&ds,sp_00);
  local_98 = (undefined **)CONCAT62(local_98._2_6_,0xfff);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_98;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_e0,__l_01,(allocator_type *)&local_168);
  pbVar1 = ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start + ds.m_read_pos;
  bVar7 = (pointer)CONCAT71(local_e0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish._1_7_,
                            local_e0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish._0_1_) ==
          local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  pvVar5 = (iterator)CONCAT71((int7)((ulong)uVar6 >> 8),bVar7);
  puVar4 = (pointer)CONCAT71((int7)((ulong)pbVar1 >> 8),
                             pbVar1 == ds.vch.
                                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                       ._M_impl.super__Vector_impl_data._M_finish || bVar7);
  if (pbVar1 != ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish && !bVar7) {
    puVar4 = (pointer)0x0;
    sVar3 = ds.m_read_pos;
    do {
      ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start[sVar3] =
           ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start[sVar3] ^
           local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start[(long)puVar4];
      puVar4 = puVar4 + 1;
      pvVar5 = (iterator)0x0;
      if (puVar4 == (pointer)CONCAT71(local_e0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                                      local_e0.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._0_1_) +
                    -(long)local_e0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start) {
        puVar4 = (pointer)0x0;
      }
      sVar3 = sVar3 + 1;
    } while ((long)ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                   _M_impl.super__Vector_impl_data._M_start != sVar3);
  }
  if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xfb;
  file_01.m_begin = (iterator)&local_198;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = (iterator)puVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
             msg_01);
  local_168.m_empty = false;
  local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = "";
  local_58 = &local_48;
  local_48 = 0xf;
  uStack_47 = 0;
  local_50 = 2;
  uStack_46 = 0;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<unsigned_char_const*>
            ((string *)&local_78,
             ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start + ds.m_read_pos,
             ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish);
  if (local_50 == local_70) {
    if (local_50 == 0) {
      local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x1;
    }
    else {
      iVar2 = bcmp(local_58,local_78,local_50);
      local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(iVar2 == 0);
    }
  }
  else {
    local_b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  local_b0.m_message.px = (element_type *)0x0;
  local_b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_b8 = "";
  local_e8 = &local_58;
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013ae148;
  local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_e8;
  local_90 = 0;
  local_98 = &PTR__lazy_ostream_013ae148;
  local_88 = boost::unit_test::lazy_ostream::inst;
  local_80 = &local_f0;
  local_f0 = (string *)&local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_b0,&local_168,1,2,REQUIRE,0xf46606,(size_t)&local_c0,0xfb,&local_e0,"ds.str()",
             &local_98);
  boost::detail::shared_count::~shared_count(&local_b0.m_message.pn);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT53(uStack_45,CONCAT12(uStack_46,CONCAT11(uStack_47,local_48))) +
                             1);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ds);
  if (in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)in.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_serializedata_xor)
{
    std::vector<std::byte> in;

    // Degenerate case
    {
        DataStream ds{in};
        ds.Xor({0x00, 0x00});
        BOOST_CHECK_EQUAL(""s, ds.str());
    }

    in.push_back(std::byte{0x0f});
    in.push_back(std::byte{0xf0});

    // Single character key
    {
        DataStream ds{in};
        ds.Xor({0xff});
        BOOST_CHECK_EQUAL("\xf0\x0f"s, ds.str());
    }

    // Multi character key

    in.clear();
    in.push_back(std::byte{0xf0});
    in.push_back(std::byte{0x0f});

    {
        DataStream ds{in};
        ds.Xor({0xff, 0x0f});
        BOOST_CHECK_EQUAL("\x0f\x00"s, ds.str());
    }
}